

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::createAndSetNoPredecessorBlock(Builder *this,char *param_1)

{
  Id id;
  Block *this_00;
  Function *pFVar1;
  Block *block;
  char *param_1_local;
  Builder *this_local;
  
  this_00 = (Block *)Block::operator_new((Block *)0x78,(size_t)param_1);
  id = getUniqueId(this);
  pFVar1 = Block::getParent(this->buildPoint);
  Block::Block(this_00,id,pFVar1);
  Block::setUnreachable(this_00);
  pFVar1 = Block::getParent(this->buildPoint);
  Function::addBlock(pFVar1,this_00);
  setBuildPoint(this,this_00);
  return;
}

Assistant:

void Builder::createAndSetNoPredecessorBlock(const char* /*name*/)
{
    Block* block = new Block(getUniqueId(), buildPoint->getParent());
    block->setUnreachable();
    buildPoint->getParent().addBlock(block);
    setBuildPoint(block);

    // if (name)
    //    addName(block->getId(), name);
}